

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Traversal.cpp
# Opt level: O0

bool __thiscall
iDynTree::Traversal::addTraversalElement
          (Traversal *this,Link *link,IJoint *jointToParent,Link *parentLink)

{
  uint uVar1;
  vector<int,_std::allocator<int>_> *this_00;
  size_type __n;
  uint *puVar2;
  vector<const_iDynTree::IJoint_*,_std::allocator<const_iDynTree::IJoint_*>_> *in_RCX;
  Link *in_RSI;
  value_type *in_RDI;
  
  uVar1 = getNrOfVisitedLinks((Traversal *)0x4700c7);
  this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 9);
  __n = Link::getIndex(in_RSI);
  puVar2 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](this_00,__n);
  *puVar2 = uVar1;
  std::vector<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>::push_back
            ((vector<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_> *)in_RCX,
             in_RDI);
  std::vector<const_iDynTree::IJoint_*,_std::allocator<const_iDynTree::IJoint_*>_>::push_back
            (in_RCX,(value_type *)in_RDI);
  std::vector<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>::push_back
            ((vector<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_> *)in_RCX,
             in_RDI);
  return true;
}

Assistant:

bool Traversal::addTraversalElement(const Link* link, const IJoint* jointToParent, const Link* parentLink)
{
    // The traversal index of the link just added will be the current getNrOfVisitedLinks()
    this->linkIndexToTraversalIndex[link->getIndex()] = this->getNrOfVisitedLinks();

    this->links.push_back(link);
    this->toParentJoints.push_back(jointToParent);
    this->parents.push_back(parentLink);

    return true;
}